

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.c
# Opt level: O0

uint main(void)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  uchar *b_00;
  uchar local_165 [8];
  uchar s_2 [13];
  uchar *res;
  uint len_1;
  uchar auStack_144 [3];
  uchar expected_1 [5];
  uchar s_1 [12];
  uint a_4 [6];
  uchar *actual;
  uint v [11];
  uchar *expected;
  uint *s;
  uint s_len;
  uint c_2 [3];
  uint b_3 [3];
  uint a_3 [3];
  uint *b_2;
  uint len;
  uint a_2 [3];
  uint *c_1;
  uint uStack_88;
  uint c_len;
  uint d [6];
  uint b_1 [3];
  uint a_1 [3];
  uint c [4];
  uint *b;
  uint a [9];
  
  memcpy(&b,&DAT_001020a0,0x24);
  puVar3 = submatrix((uint *)&b,3,7);
  a_1[1] = 4;
  a_1[2] = 5;
  bVar1 = AR_EQ(puVar3,a_1 + 1,4);
  REQUIRE((uint)bVar1);
  vector_free(puVar3);
  b_1[1] = 0;
  b_1[2] = 1;
  a_1[0] = 2;
  d[4] = 4;
  d[5] = 5;
  b_1[0] = 6;
  _uStack_88 = 0x100000000;
  d[0] = 2;
  d[1] = 4;
  d[2] = 5;
  d[3] = 6;
  c_1._4_4_ = 0;
  a_2._4_8_ = stack(b_1 + 1,3,d + 4,3,(uint *)((long)&c_1 + 4));
  bVar1 = AR_EQ(&uStack_88,(uint *)a_2._4_8_,6);
  REQUIRE((uint)bVar1);
  REQUIRE((uint)(c_1._4_4_ == 6));
  vector_free((uint *)a_2._4_8_);
  stack0xffffffffffffff5c = 0xa00000005;
  a_2[0] = 100;
  b_2._0_4_ = 3;
  puVar3 = vector_copy((uint *)((long)&b_2 + 4),3);
  bVar1 = AR_EQ((uint *)((long)&b_2 + 4),puVar3,(uint)b_2);
  REQUIRE((uint)bVar1);
  vector_free(puVar3);
  b_3[1] = 1;
  b_3[2] = 2;
  c_2[1] = 9;
  c_2[2] = 8;
  b_3[0] = 7;
  stack0xffffffffffffff2c = 0xa0000000a;
  c_2[0] = 10;
  s._0_4_ = 0;
  puVar3 = vector_sum(b_3 + 1,3,c_2 + 1,3,(uint *)&s);
  bVar1 = AR_EQ((uint *)((long)&s + 4),puVar3,3);
  REQUIRE((uint)bVar1);
  REQUIRE((uint)((int)s == 3));
  vector_free(puVar3);
  stack0xffffffffffffff18 = "hello world";
  memcpy(&actual,L"hello world",0x2c);
  b_00 = vector_to_str((uint *)&actual,0xb);
  bVar1 = STR_EQ((uchar *)stack0xffffffffffffff18,b_00,0xb);
  REQUIRE((uint)bVar1);
  free(b_00);
  s_1[4] = '\x01';
  s_1[5] = '\0';
  s_1[6] = '\0';
  s_1[7] = '\0';
  s_1[8] = '\x02';
  s_1[9] = '\0';
  s_1[10] = '\0';
  s_1[0xb] = '\0';
  uVar2 = sum((uint *)(s_1 + 4),6);
  REQUIRE((uint)(uVar2 == 0x3f));
  auStack_144[0] = 'h';
  auStack_144[1] = 'e';
  auStack_144[2] = 'l';
  builtin_memcpy(expected_1,"lo wo",5);
  builtin_memcpy(s_1,"rld",4);
  stack0xfffffffffffffeb7 = 0x206f6c6c;
  len_1._3_1_ = 0;
  res._0_4_ = 0;
  s_2._5_8_ = substring(auStack_144,2,5,(uint *)&res);
  bVar1 = STR_EQ((uchar *)((long)&res + 7),(uchar *)s_2._5_8_,5);
  REQUIRE((uint)bVar1);
  REQUIRE((uint)((int)res == 4));
  free((void *)s_2._5_8_);
  builtin_memcpy(local_165,"hello wo",8);
  builtin_memcpy(s_2,"rld!",5);
  uVar2 = strlength(local_165);
  REQUIRE((uint)(uVar2 == 0xc));
  return total;
}

Assistant:

uint32_t main()
{
    { // submatrix test
        uint32_t a[] = {1, 2, 3, 4, 5, 6, 7, 8, 9};
        uint32_t *b = submatrix(a, 3, 7);
        uint32_t c[] = {4, 5, 6, 7};
        REQUIRE(AR_EQ(b, c, LEN(c)));
        vector_free(b);
    }

    { // stack test
        uint32_t a[] = {0, 1, 2};
        uint32_t b[] = {4, 5, 6};
        uint32_t d[] = {0, 1, 2, 4, 5, 6};
        uint32_t c_len = 0;
        uint32_t *c = stack(a, 3, b, 3, &c_len);
        REQUIRE(AR_EQ(d, c, LEN(d)));
        REQUIRE(c_len == LEN(d));
        vector_free(c);
    }

    { // vector copy test
        uint32_t a[] = {5, 10, 100};
        uint32_t len = LEN(a);
        uint32_t *b = vector_copy(a, len);
        REQUIRE(AR_EQ(a, b, len));
        vector_free(b);
    }

    { // vector sum test
        uint32_t a[] = {1, 2, 3};
        uint32_t b[] = {9, 8, 7};
        uint32_t c[] = {10, 10, 10};
        uint32_t s_len = 0;
        uint32_t *s = vector_sum(a, LEN(a), b, LEN(b), &s_len);
        REQUIRE(AR_EQ(c, s, LEN(c)));
        REQUIRE(s_len == LEN(c));
        vector_free(s);
    }

    { // vector to str test
        uint8_t *expected = "hello world";
        uint32_t v[] = {104, 101, 108, 108, 111, 32, 119, 111, 114, 108, 100};
        uint8_t *actual = vector_to_str(v, LEN(v));
        REQUIRE(STR_EQ(expected, actual, LEN(v)));
        free(actual);
    }

    { // sum test
        uint32_t a[] = {1, 2, 4, 8, 16, 32};
        REQUIRE(sum(a, LEN(a)) == 63);
    }

    { // substring test
        uint8_t s[] = "hello world";
        uint8_t expected[] = "llo ";
        uint32_t len = 0;
        uint8_t *res = substring(s, 2, 5, &len);
        REQUIRE(STR_EQ(expected, res, LEN(expected)));
        REQUIRE(len == 4);
        free(res);
    }

    { // strlength test
        uint8_t s[] = "hello world!";
        REQUIRE(strlength(s) == LEN(s) - 1);
    }

    TEST_EXIT;
}